

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_CompressedFormatError_Test::
~BioparserFastaTest_CompressedFormatError_Test(BioparserFastaTest_CompressedFormatError_Test *this)

{
  BioparserFastaTest_CompressedFormatError_Test *this_local;
  
  ~BioparserFastaTest_CompressedFormatError_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedFormatError) {
  Setup("sample.fastq.gz");
  try {
    s = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::FastaParser] error: invalid file format");
  }
}